

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cesl_format.c
# Opt level: O0

cesl_format_t * cesl_format_ui64(cesl_format_t *self,uint64_t value)

{
  size_t sVar1;
  size_t min_required_size;
  uint64_t value_local;
  cesl_format_t *self_local;
  
  if (self->cur_pos + 0x18 < self->buf_max_size) {
    sVar1 = cesl_uint64_to_str(value,self->buf + self->cur_pos,'\n');
    self->cur_pos = sVar1 + self->cur_pos;
  }
  else {
    self->error_code = 1;
  }
  return self;
}

Assistant:

cesl_format_t *cesl_format_ui64(cesl_format_t *self, uint64_t value)
{
    const size_t min_required_size = (sizeof(uint64_t) * 8) / 3 + 3; // 1 for rounding, 1 for sign, 1 for '\0'

    if (self->cur_pos + min_required_size >= self->buf_max_size) {
        self->error_code = cesl_format_buffer_full_error;
        return self;
    }
    self->cur_pos += cesl_uint64_to_str (value, &(self->buf[self->cur_pos]), 10);
    return self;
}